

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc2.cc
# Opt level: O0

void RC2_encrypt(ulong *data,RC2_KEY *key)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint32_t l;
  ushort local_34;
  uint16_t t;
  uint16_t x3;
  uint16_t x2;
  uint16_t x1;
  uint16_t x0;
  uint16_t *p1;
  uint16_t *p0;
  int n;
  int i;
  RC2_KEY *key_local;
  uint32_t *d_local;
  
  t = (uint16_t)(int)*data;
  local_34 = (ushort)((uint)(int)*data >> 0x10);
  l._2_2_ = (ushort)*(undefined4 *)((long)data + 4);
  l._0_2_ = (ushort)((uint)*(undefined4 *)((long)data + 4) >> 0x10);
  p0._0_4_ = 3;
  p0._4_4_ = 5;
  p1 = (uint16_t *)key;
  while( true ) {
    do {
      uVar1 = t + (local_34 & ((ushort)l ^ 0xffff)) + (l._2_2_ & (ushort)l) + *p1;
      t = uVar1 * 2 | (ushort)((int)(uint)uVar1 >> 0xf);
      uVar1 = local_34 + (l._2_2_ & (t ^ 0xffff)) + ((ushort)l & t) + p1[1];
      local_34 = uVar1 * 4 | (ushort)((int)(uint)uVar1 >> 0xe);
      puVar2 = p1 + 3;
      uVar1 = l._2_2_ + ((ushort)l & (local_34 ^ 0xffff)) + (t & local_34) + p1[2];
      l._2_2_ = uVar1 * 8 | (ushort)((int)(uint)uVar1 >> 0xd);
      p1 = p1 + 4;
      uVar1 = (ushort)l + (t & (l._2_2_ ^ 0xffff)) + (local_34 & l._2_2_) + *puVar2;
      l._0_2_ = uVar1 * 0x20 | (ushort)((int)(uint)uVar1 >> 0xb);
      p0._4_4_ = p0._4_4_ + -1;
    } while (p0._4_4_ != 0);
    p0._0_4_ = (int)p0 + -1;
    if ((int)p0 == 0) break;
    p0._4_4_ = 5;
    if ((int)p0 == 2) {
      p0._4_4_ = 6;
    }
    t = t + *(short *)((long)key->data + (long)(int)((ushort)l & 0x3f) * 2);
    local_34 = local_34 + *(short *)((long)key->data + (long)(int)(t & 0x3f) * 2);
    l._2_2_ = l._2_2_ + *(short *)((long)key->data + (long)(int)(local_34 & 0x3f) * 2);
    l._0_2_ = (ushort)l + *(short *)((long)key->data + (long)(int)(l._2_2_ & 0x3f) * 2);
  }
  *(uint *)data = CONCAT22(local_34,t);
  *(uint *)((long)data + 4) = CONCAT22((ushort)l,l._2_2_);
  return;
}

Assistant:

static void RC2_encrypt(uint32_t *d, RC2_KEY *key) {
  int i, n;
  uint16_t *p0, *p1;
  uint16_t x0, x1, x2, x3, t;
  uint32_t l;

  l = d[0];
  x0 = (uint16_t)l & 0xffff;
  x1 = (uint16_t)(l >> 16L);
  l = d[1];
  x2 = (uint16_t)l & 0xffff;
  x3 = (uint16_t)(l >> 16L);

  n = 3;
  i = 5;

  p0 = p1 = &key->data[0];
  for (;;) {
    t = (x0 + (x1 & ~x3) + (x2 & x3) + *(p0++)) & 0xffff;
    x0 = (t << 1) | (t >> 15);
    t = (x1 + (x2 & ~x0) + (x3 & x0) + *(p0++)) & 0xffff;
    x1 = (t << 2) | (t >> 14);
    t = (x2 + (x3 & ~x1) + (x0 & x1) + *(p0++)) & 0xffff;
    x2 = (t << 3) | (t >> 13);
    t = (x3 + (x0 & ~x2) + (x1 & x2) + *(p0++)) & 0xffff;
    x3 = (t << 5) | (t >> 11);

    if (--i == 0) {
      if (--n == 0) {
        break;
      }
      i = (n == 2) ? 6 : 5;

      x0 += p1[x3 & 0x3f];
      x1 += p1[x0 & 0x3f];
      x2 += p1[x1 & 0x3f];
      x3 += p1[x2 & 0x3f];
    }
  }

  d[0] = (uint32_t)(x0 & 0xffff) | ((uint32_t)(x1 & 0xffff) << 16L);
  d[1] = (uint32_t)(x2 & 0xffff) | ((uint32_t)(x3 & 0xffff) << 16L);
}